

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.tpl.h
# Opt level: O2

Code * __thiscall
r_exec::Mem<r_exec::LObject,_r_exec::MemVolatile>::build_object
          (Mem<r_exec::LObject,_r_exec::MemVolatile> *this,Atom *head)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  LObject *this_00;
  undefined4 extraout_var;
  Atom *pAVar5;
  short sVar6;
  short sVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  
  pAVar5 = head;
  cVar1 = r_code::Atom::getDescriptor();
  if (cVar1 == -0x38) {
    this_00 = (LObject *)operator_new(0x448);
    r_exec::Group::Group((Group *)this_00,(Mem *)0x0);
  }
  else {
    uVar3 = r_code::Atom::asOpcode();
    sVar2 = (short)uVar3;
    if (sVar2 == (short)Opcodes::Fact) {
      this_00 = (LObject *)r_exec::Fact::operator_new((Fact *)0x150,(ulong)pAVar5);
      r_exec::Fact::Fact((Fact *)this_00);
    }
    else if (sVar2 == (short)Opcodes::AntiFact) {
      this_00 = (LObject *)r_exec::AntiFact::operator_new((AntiFact *)0x150,(ulong)pAVar5);
      r_exec::AntiFact::AntiFact((AntiFact *)this_00);
    }
    else if (sVar2 == (short)Opcodes::Pred) {
      this_00 = (LObject *)operator_new(0x180);
      r_exec::Pred::Pred((Pred *)this_00);
    }
    else if (sVar2 == (short)Opcodes::Goal) {
      this_00 = (LObject *)operator_new(0x160);
      r_exec::Goal::Goal((Goal *)this_00);
    }
    else if (sVar2 == (short)Opcodes::ICst) {
      this_00 = (LObject *)operator_new(0x170);
      r_exec::ICST::ICST((ICST *)this_00);
    }
    else if (sVar2 == (short)Opcodes::MkRdx) {
      this_00 = (LObject *)operator_new(0x158);
      r_exec::MkRdx::MkRdx((MkRdx *)this_00);
    }
    else {
      auVar7 = pshuflw(ZEXT416(uVar3),ZEXT416(uVar3),0);
      sVar6 = auVar7._0_2_;
      auVar9._0_2_ = -(ushort)((short)Opcodes::MkActChg == sVar6);
      sVar8 = auVar7._2_2_;
      auVar9._2_2_ = -(ushort)((short)Opcodes::MkHighAct == sVar8);
      auVar9._4_2_ = -(ushort)((short)Opcodes::MkHighSln == sVar6);
      auVar9._6_2_ = -(ushort)((short)Opcodes::MkLowAct == sVar8);
      auVar9._8_2_ = -(ushort)((short)Opcodes::MkLowRes == sVar6);
      auVar9._10_2_ = -(ushort)((short)Opcodes::MkLowSln == sVar8);
      auVar9._12_2_ = -(ushort)((short)Opcodes::MkNew == sVar6);
      auVar9._14_2_ = -(ushort)((short)Opcodes::MkSlnChg == sVar8);
      if ((((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar9 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar9 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar9 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar9 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar9 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar9 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar9 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar9 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar9 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar9 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar9 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar9 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar9._14_2_ >> 7 & 1) == 0) && (auVar9._14_2_ & 0x8000) == 0) &&
          (sVar2 != (short)Opcodes::Success)) && (sVar2 != (short)Opcodes::Perf)) {
        this_00 = (LObject *)operator_new(0x150);
        LObject::LObject((LObject *)this_00,(Mem *)0x0);
      }
      else {
        this_00 = (LObject *)operator_new(200);
        r_code::LObject::LObject(this_00);
      }
    }
  }
  iVar4 = (*(this_00->super_Code).super__Object._vptr__Object[4])(this_00,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar4),head);
  return &this_00->super_Code;
}

Assistant:

r_code::Code *Mem<O, S>::build_object(Atom head) const
{
    r_code::Code *object;

    switch (head.getDescriptor()) {
    case Atom::GROUP:
        object = new Group();
        break;

    default: {
        uint16_t opcode = head.asOpcode();

        if (opcode == Opcodes::Fact) {
            object = new Fact();
        } else if (opcode == Opcodes::AntiFact) {
            object = new AntiFact();
        } else if (opcode == Opcodes::Pred) {
            object = new Pred();
        } else if (opcode == Opcodes::Goal) {
            object = new Goal();
        } else if (opcode == Opcodes::ICst) {
            object = new ICST();
        } else if (opcode == Opcodes::MkRdx) {
            object = new MkRdx();
        } else if (opcode == Opcodes::MkActChg ||
                   opcode == Opcodes::MkHighAct ||
                   opcode == Opcodes::MkHighSln ||
                   opcode == Opcodes::MkLowAct ||
                   opcode == Opcodes::MkLowRes ||
                   opcode == Opcodes::MkLowSln ||
                   opcode == Opcodes::MkNew ||
                   opcode == Opcodes::MkSlnChg ||
                   opcode == Opcodes::Success ||
                   opcode == Opcodes::Perf) {
            object = new r_code::LObject();
        } else if (O::RequiresPacking()) {
            object = new r_code::LObject();    // temporary sand box for assembling code; will be packed into an O at injection time.
        } else {
            object = new O();
        }

        break;
    }
    }

    object->code(0) = head;
    return object;
}